

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tile.cpp
# Opt level: O1

void __thiscall
Tile::Tile(Tile *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,bool suppressUpdate)

{
  undefined3 in_register_00000081;
  
  this->_vptr_Tile = (_func_int **)&PTR__Tile_001d1d10;
  (this->_position).x = 0;
  (this->_position).y = 0;
  this->_boardPtr = boardPtr;
  this->_position = *position;
  this->_direction = NORTH;
  this->_highlight = false;
  if (CONCAT31(in_register_00000081,suppressUpdate) != 0) {
    return;
  }
  addUpdate(this,false,noAdjacentUpdates);
  return;
}

Assistant:

Tile::Tile(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, bool suppressUpdate) {
    _boardPtr = boardPtr;
    _position = position;
    _direction = NORTH;
    _highlight = false;
    if (!suppressUpdate) {
        addUpdate(false, noAdjacentUpdates);
    }
}